

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

Aig_Man_t * Dch_DeriveChoiceAigInt(Aig_Man_t *pAig,int fSkipRedSupps)

{
  void *pvVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *p;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  size_t __nmemb;
  long lVar8;
  
  p = Aig_ManStart(pAig->vObjs->nSize);
  __nmemb = (size_t)pAig->vObjs->nSize;
  ppAVar4 = (Aig_Obj_t **)calloc(__nmemb,8);
  p->pEquivs = ppAVar4;
  ppAVar4 = (Aig_Obj_t **)calloc(__nmemb,8);
  p->pReprs = ppAVar4;
  Aig_ManCleanData(pAig);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar6 = pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar8];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar8 = lVar8 + 1;
      pVVar6 = pAig->vCis;
    } while (lVar8 < pVVar6->nSize);
  }
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    pVVar6 = pAig->vObjs;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pAVar5 = (Aig_Obj_t *)pVVar6->pArray[lVar8];
        if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
          Dch_DeriveChoiceAigNode(p,pAig,pAVar5,fSkipRedSupps);
          pVVar6 = pAig->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
    pVVar6 = pAig->vCos;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        if (((ulong)pVVar6->pArray[lVar8] & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar2 = *(ulong *)((long)pVVar6->pArray[lVar8] + 8);
        uVar7 = uVar2 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar2 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        if (p->pReprs != (Aig_Obj_t **)0x0) {
          pAVar3 = p->pReprs[*(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x24)];
          if (pAVar3 != (Aig_Obj_t *)0x0) {
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)(((uint)pAVar5 ^
                              (*(uint *)&pAVar3->field_0x18 ^
                              *(uint *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18)) >> 3) & 1) ^
                     (ulong)pAVar3);
          }
        }
        Aig_ObjCreateCo(p,pAVar5);
        lVar8 = lVar8 + 1;
        pVVar6 = pAig->vCos;
      } while (lVar8 < pVVar6->nSize);
    }
    Aig_ManSetRegNum(p,pAig->nRegs);
    return p;
  }
  __assert_fail("pAig->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                ,0x204,"Aig_Man_t *Dch_DeriveChoiceAigInt(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Dch_DeriveChoiceAigInt( Aig_Man_t * pAig, int fSkipRedSupps )
{
    Aig_Man_t * pChoices;
    Aig_Obj_t * pObj;
    int i;
    // start recording equivalences
    pChoices = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pChoices->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    pChoices->pReprs  = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // map constants and PIs
    Aig_ManCleanData( pAig );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pChoices);
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pChoices );
    // construct choices for the internal nodes
    assert( pAig->pReprs != NULL );
    Aig_ManForEachNode( pAig, pObj, i ) 
        Dch_DeriveChoiceAigNode( pChoices, pAig, pObj, fSkipRedSupps );
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( pChoices, Aig_ObjChild0CopyRepr(pChoices, pObj) );
    Aig_ManSetRegNum( pChoices, Aig_ManRegNum(pAig) );
    return pChoices;
}